

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ringbuffer.cpp
# Opt level: O3

RingBufferPtr __thiscall
RingBuffer::Create(RingBuffer *this,size_t sz,size_t elem_sz,int limit_writes)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  undefined8 *puVar4;
  overflow_error *this_00;
  size_t sVar5;
  
  if (sz == 0) {
    sVar5 = 0;
  }
  else {
    uVar3 = sz >> 1 | sz;
    uVar3 = uVar3 >> 2 | uVar3;
    uVar3 = uVar3 >> 4 | uVar3;
    uVar3 = uVar3 >> 8 | uVar3;
    uVar3 = uVar3 >> 0x10 | uVar3;
    sVar5 = uVar3 >> 0x20 | uVar3;
  }
  uVar3 = sVar5 + 1;
  if ((sz < uVar3) &&
     (auVar1._8_8_ = 0, auVar1._0_8_ = elem_sz, auVar2._8_8_ = 0, auVar2._0_8_ = uVar3,
     SUB168(auVar1 * auVar2,8) == 0)) {
    puVar4 = (undefined8 *)operator_new(0x50,uVar3 * elem_sz);
    *puVar4 = 0;
    puVar4[1] = 0;
    puVar4[6] = uVar3 * elem_sz;
    (this->mWritePtr).super___atomic_base<unsigned_long>._M_i = (__int_type_conflict2)puVar4;
    if (limit_writes == 0) {
      sz = sVar5;
    }
    puVar4[2] = sz;
    puVar4[3] = sVar5;
    puVar4[4] = elem_sz;
    return (__uniq_ptr_data<RingBuffer,_std::default_delete<RingBuffer>,_true,_true>)
           (__uniq_ptr_data<RingBuffer,_std::default_delete<RingBuffer>,_true,_true>)this;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this_00,"Ring buffer size overflow");
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

RingBufferPtr RingBuffer::Create(size_t sz, size_t elem_sz, int limit_writes)
{
    size_t power_of_two{0u};
    if(sz > 0)
    {
        power_of_two = sz;
        power_of_two |= power_of_two>>1;
        power_of_two |= power_of_two>>2;
        power_of_two |= power_of_two>>4;
        power_of_two |= power_of_two>>8;
        power_of_two |= power_of_two>>16;
#if SIZE_MAX > UINT_MAX
        power_of_two |= power_of_two>>32;
#endif
    }
    ++power_of_two;
    if(power_of_two <= sz || power_of_two > std::numeric_limits<size_t>::max()/elem_sz)
        throw std::overflow_error{"Ring buffer size overflow"};

    const size_t bufbytes{power_of_two * elem_sz};
    RingBufferPtr rb{new(FamCount(bufbytes)) RingBuffer{bufbytes}};
    rb->mWriteSize = limit_writes ? sz : (power_of_two-1);
    rb->mSizeMask = power_of_two - 1;
    rb->mElemSize = elem_sz;

    return rb;
}